

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ahost.c
# Opt level: O0

void ai_callback(void *arg,int status,int timeouts,ares_addrinfo *result)

{
  FILE *__stream;
  undefined8 uVar1;
  sockaddr_in6 *in_addr_1;
  sockaddr_in *in_addr;
  void *ptr;
  char addr_buf [64];
  ares_addrinfo_node *node;
  ares_addrinfo *result_local;
  int timeouts_local;
  int status_local;
  void *arg_local;
  
  __stream = _stderr;
  addr_buf[0x38] = '\0';
  addr_buf[0x39] = '\0';
  addr_buf[0x3a] = '\0';
  addr_buf[0x3b] = '\0';
  addr_buf[0x3c] = '\0';
  addr_buf[0x3d] = '\0';
  addr_buf[0x3e] = '\0';
  addr_buf[0x3f] = '\0';
  if (status == 0) {
    for (addr_buf._56_8_ = result->nodes; addr_buf._56_8_ != 0;
        addr_buf._56_8_ = *(undefined8 *)(addr_buf._56_8_ + 0x20)) {
      memset(&ptr,0,0x40);
      if (*(int *)(addr_buf._56_8_ + 8) == 2) {
        in_addr = (sockaddr_in *)(*(long *)(addr_buf._56_8_ + 0x18) + 4);
LAB_00101b1e:
        ares_inet_ntop(*(undefined4 *)(addr_buf._56_8_ + 8),in_addr,&ptr,0x40);
        printf("%-32s\t%s\n",result->name,&ptr);
      }
      else if (*(int *)(addr_buf._56_8_ + 8) == 10) {
        in_addr = (sockaddr_in *)(*(long *)(addr_buf._56_8_ + 0x18) + 8);
        goto LAB_00101b1e;
      }
    }
    ares_freeaddrinfo(result);
  }
  else {
    uVar1 = ares_strerror(status);
    fprintf(__stream,"%s: %s\n",arg,uVar1);
    final_rv = 3;
  }
  return;
}

Assistant:

static void ai_callback(void *arg, int status, int timeouts,
                        struct ares_addrinfo *result)
{
  struct ares_addrinfo_node *node = NULL;
  (void)timeouts;


  if (status != ARES_SUCCESS) {
    fprintf(stderr, "%s: %s\n", (char *)arg, ares_strerror(status));
    final_rv = RV_FAIL;
    return;
  }

  for (node = result->nodes; node != NULL; node = node->ai_next) {
    char        addr_buf[64] = "";
    const void *ptr          = NULL;
    if (node->ai_family == AF_INET) {
      const struct sockaddr_in *in_addr =
        (const struct sockaddr_in *)((void *)node->ai_addr);
      ptr = &in_addr->sin_addr;
    } else if (node->ai_family == AF_INET6) {
      const struct sockaddr_in6 *in_addr =
        (const struct sockaddr_in6 *)((void *)node->ai_addr);
      ptr = &in_addr->sin6_addr;
    } else {
      continue;
    }
    ares_inet_ntop(node->ai_family, ptr, addr_buf, sizeof(addr_buf));
    printf("%-32s\t%s\n", result->name, addr_buf);
  }

  ares_freeaddrinfo(result);
}